

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialRigidBodyInertia *
RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
          (Scalar mass,Vector3d *com,Matrix3d *inertia_C)

{
  Scalar *pSVar1;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RDX;
  SpatialRigidBodyInertia *in_RDI;
  Scalar in_XMM0_Qa;
  Matrix3d I;
  SpatialRigidBodyInertia *result;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffe58;
  SpatialRigidBodyInertia *this;
  SpatialRigidBodyInertia *in_stack_fffffffffffffe70;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *in_stack_fffffffffffffe80;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffea0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *in_stack_fffffffffffffea8;
  Vector3d *in_stack_fffffffffffffec0;
  
  this = in_RDI;
  SpatialRigidBodyInertia(in_stack_fffffffffffffe70);
  this->m = in_XMM0_Qa;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffea0);
  Vector3_t::operator=((Vector3_t *)this,in_stack_fffffffffffffe58);
  VectorCrossMatrix(in_stack_fffffffffffffec0);
  VectorCrossMatrix(in_stack_fffffffffffffec0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(in_RDX);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)in_RDX);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
  ::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>>
            ((Matrix3_t *)this,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
              *)in_RDX);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x84705c);
  this->Ixx = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x847080);
  this->Iyx = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x8470a3);
  this->Iyy = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x8470c7);
  this->Izx = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x8470ec);
  this->Izy = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)in_RDX
                      ,0x84710f);
  this->Izz = *pSVar1;
  return in_RDI;
}

Assistant:

static SpatialRigidBodyInertia createFromMassComInertiaC (Scalar mass, const Vector3d &com, const Matrix3d &inertia_C) {
    SpatialRigidBodyInertia result;
    result.m = mass;
    result.h = com * mass;
    Matrix3d I = inertia_C + VectorCrossMatrix (com) * VectorCrossMatrix(com).transpose() * mass;
    result.Ixx = I(0,0);
    result.Iyx = I(1,0);
    result.Iyy = I(1,1);
    result.Izx = I(2,0);
    result.Izy = I(2,1);
    result.Izz = I(2,2);
    return result;
  }